

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O1

btMatrix3x3 * __thiscall btSoftBody::Body::invWorldInertia(Body *this)

{
  btMatrix3x3 *pbVar1;
  
  if (invWorldInertia()::iwi == '\0') {
    invWorldInertia();
  }
  pbVar1 = &invWorldInertia::iwi;
  if (this->m_soft != (Cluster *)0x0) {
    pbVar1 = &this->m_soft->m_invwi;
  }
  if (this->m_rigid != (btRigidBody *)0x0) {
    pbVar1 = (btMatrix3x3 *)&(this->m_rigid->super_btCollisionObject).field_0x14c;
  }
  return pbVar1;
}

Assistant:

const btMatrix3x3&			invWorldInertia() const
		{
			static const btMatrix3x3	iwi(0,0,0,0,0,0,0,0,0);
			if(m_rigid) return(m_rigid->getInvInertiaTensorWorld());
			if(m_soft)	return(m_soft->m_invwi);
			return(iwi);
		}